

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int NET_ParseUrl(char *url,char *proto,char *host,int *port,char *fn)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *__dest;
  byte *pbVar4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *__s;
  
  sVar3 = strlen(url);
  __dest = (byte *)malloc(sVar3 + 1);
  strcpy((char *)__dest,url);
  *port = 0x50;
  builtin_strncpy(proto,"http:",6);
  builtin_strncpy(host,"localhost",10);
  fn[0] = '/';
  fn[1] = '\0';
  pbVar4 = (byte *)strstr((char *)__dest,"http:");
  if (pbVar4 == (byte *)0x0) {
    pbVar4 = (byte *)strstr((char *)__dest,"root:");
    if (pbVar4 != (byte *)0x0) goto LAB_00138e46;
    pbVar6 = (byte *)strstr((char *)__dest,"ftp:");
    pbVar4 = __dest;
    if (pbVar6 != (byte *)0x0) {
      iVar2 = 1;
      if (pbVar6 != __dest) goto LAB_00138e50;
      builtin_strncpy(proto,"ftp:",5);
      *port = 0x15;
      pbVar4 = __dest + 4;
    }
  }
  else {
LAB_00138e46:
    iVar2 = 1;
    if (pbVar4 != __dest) goto LAB_00138e50;
    pbVar4 = __dest + 5;
  }
  if (*pbVar4 == 0x2f) {
    pbVar4 = pbVar4 + (ulong)(pbVar4[1] == 0x2f) * 2;
  }
  iVar2 = strcmp(proto,"http:");
  if (iVar2 == 0) {
    pcVar5 = strchr((char *)pbVar4,0x40);
    pbVar6 = (byte *)(pcVar5 + 1);
    if (pcVar5 == (char *)0x0) {
      pbVar6 = pbVar4;
    }
    uVar7 = 0;
    __s = pbVar6;
    while ((0x3a < (ulong)*__s || ((0x400800000000001U >> ((ulong)*__s & 0x3f) & 1) == 0))) {
      __s = __s + 1;
      uVar7 = uVar7 + 1;
    }
    iVar2 = 1;
    if (99 < uVar7) goto LAB_00138e50;
    strncpy(host,(char *)pbVar6,uVar7);
    host[uVar7] = '\0';
    bVar1 = *__s;
    if (bVar1 == 0x3a) {
      __s = __s + 1;
      __isoc99_sscanf(__s,"%d",port);
      for (; (bVar1 = *__s, bVar1 != 0 && (bVar1 != 0x2f)); __s = __s + 1) {
      }
    }
  }
  else {
    for (uVar7 = 0; (pbVar4[uVar7] != 0 && (pbVar4[uVar7] != 0x2f)); uVar7 = uVar7 + 1) {
    }
    iVar2 = 1;
    if (99 < uVar7) goto LAB_00138e50;
    __s = pbVar4 + uVar7;
    strncpy(host,(char *)pbVar4,uVar7);
    host[uVar7] = '\0';
    bVar1 = pbVar4[uVar7];
  }
  iVar2 = 0;
  if (bVar1 != 0) {
    sVar3 = strlen((char *)__s);
    iVar2 = 1;
    if (sVar3 < 0x4b0) {
      strcpy(fn,(char *)__s);
      iVar2 = 0;
    }
  }
LAB_00138e50:
  free(__dest);
  return iVar2;
}

Assistant:

static int NET_ParseUrl(const char *url, char *proto, char *host, int *port, 
		 char *fn)
{
  /* parses urls into their bits */
  /* returns 1 if error, else 0 */

  char *urlcopy, *urlcopyorig;
  char *ptrstr;
  char *thost;
  int isftp = 0;
  size_t icount;

  /* figure out if there is a http: or  ftp: */

  urlcopyorig = urlcopy = (char *) malloc(strlen(url)+1);
  strcpy(urlcopy,url);

  /* set some defaults */
  *port = 80;
  strcpy(proto,"http:");
  strcpy(host,"localhost");
  strcpy(fn,"/");
  
  ptrstr = strstr(urlcopy,"http:");
  if (ptrstr == NULL) {
    /* Nope, not http: */
    ptrstr = strstr(urlcopy,"root:");
    if (ptrstr == NULL) {
      /* Nope, not root either */
      ptrstr = strstr(urlcopy,"ftp:");
      if (ptrstr != NULL) {
	if (ptrstr == urlcopy) {
	  strcpy(proto,"ftp:");
	  *port = 21;
	  isftp++;
	  urlcopy += 4; /* move past ftp: */
	} else {
	  /* not at the beginning, bad url */
	  free(urlcopyorig);
	  return 1;
	}
      }
    } else {
      if (ptrstr == urlcopy) {
	urlcopy += 5; /* move past root: */
      } else {
	/* not at the beginning, bad url */
	free(urlcopyorig);
	return 1;
      }
    }
  } else {
    if (ptrstr == urlcopy) {
      urlcopy += 5; /* move past http: */
    } else {
      free(urlcopyorig);
      return 1;
    }
  }

  /* got the protocol */
  /* get the hostname */
  if (urlcopy[0] == '/' && urlcopy[1] == '/') {
    /* we have a hostname */
    urlcopy += 2; /* move past the // */
  }
  /* do this only if http */
  if (!strcmp(proto,"http:")) {

    /* Move past any user:password */
    if ((thost = strchr(urlcopy, '@')) != NULL)
      urlcopy = thost+1;

    thost = urlcopy;
    icount=0;
    while (*urlcopy != '/' && *urlcopy != ':' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    
    /* we should either be at the end of the string, have a /, or have a : */
    if (*urlcopy == ':') {
      /* follows a port number */
      urlcopy++;
      sscanf(urlcopy,"%d",port);
      while (*urlcopy != '/' && *urlcopy) urlcopy++; /* step to the */
    }
  } else {
    /* do this for ftp */
    
    thost = urlcopy;
    icount = 0;
    while (*urlcopy != '/' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    /* Now, we should either be at the end of the string, or have a / */
    
  }
  /* Now the rest is a fn */

  if (*urlcopy) {
    if (strlen(urlcopy) > MAXLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strcpy(fn,urlcopy);
  }
  free(urlcopyorig);
  return 0;
}